

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

String * kj::encodeUriUserInfo(String *__return_storage_ptr__,ArrayPtr<const_unsigned_char> bytes)

{
  ArrayDisposer **this;
  size_t sVar1;
  Array<char> local_88;
  char local_6b [3];
  byte *pbStack_68;
  byte b;
  uchar *__end1;
  byte *local_50;
  uchar *__begin1;
  ArrayPtr<const_unsigned_char> *__range1;
  Vector<char> result;
  ArrayPtr<const_unsigned_char> bytes_local;
  
  result.builder.disposer = (ArrayDisposer *)bytes.ptr;
  this = &result.builder.disposer;
  sVar1 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)this);
  Vector<char>::Vector((Vector<char> *)&__range1,sVar1 + 1);
  __begin1 = (uchar *)this;
  local_50 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)this);
  pbStack_68 = ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)__begin1);
  for (; local_50 != pbStack_68; local_50 = local_50 + 1) {
    local_6b[2] = *local_50;
    if (((((byte)local_6b[2] < 0x41) || (0x5a < (byte)local_6b[2])) &&
        (((byte)local_6b[2] < 0x61 || (0x7a < (byte)local_6b[2])))) &&
       (((((byte)local_6b[2] < 0x30 || (0x39 < (byte)local_6b[2])) &&
         (((byte)local_6b[2] < 0x26 || (0x2e < (byte)local_6b[2])))) &&
        ((((local_6b[2] != 0x5f && (local_6b[2] != 0x21)) && (local_6b[2] != 0x7e)) &&
         (local_6b[2] != 0x24)))))) {
      local_6b[1] = 0x25;
      Vector<char>::add<char>((Vector<char> *)&__range1,local_6b + 1);
      Vector<char>::add<char_const&>
                ((Vector<char> *)&__range1,"0123456789ABCDEF" + ((byte)local_6b[2] >> 4));
      Vector<char>::add<char_const&>
                ((Vector<char> *)&__range1,"0123456789ABCDEF" + ((byte)local_6b[2] & 0xf));
    }
    else {
      Vector<char>::add<unsigned_char&>((Vector<char> *)&__range1,(uchar *)(local_6b + 2));
    }
  }
  local_6b[0] = '\0';
  Vector<char>::add<char>((Vector<char> *)&__range1,local_6b);
  Vector<char>::releaseAsArray(&local_88,(Vector<char> *)&__range1);
  String::String(__return_storage_ptr__,&local_88);
  Array<char>::~Array(&local_88);
  Vector<char>::~Vector((Vector<char> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

String encodeUriUserInfo(ArrayPtr<const byte> bytes) {
  Vector<char> result(bytes.size() + 1);
  for (byte b: bytes) {
    if (('A' <= b && b <= 'Z') ||
        ('a' <= b && b <= 'z') ||
        ('0' <= b && b <= '9') ||
        ('&' <= b && b <= '.') ||
        b == '_' || b == '!' || b == '~' || b == '$') {
      result.add(b);
    } else {
      result.add('%');
      result.add(HEX_DIGITS_URI[b/16]);
      result.add(HEX_DIGITS_URI[b%16]);
    }
  }
  result.add('\0');
  return String(result.releaseAsArray());
}